

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O2

bool Cipher::doSimulatedAnnealing5
               (TParameters *params,TFreqMap *freqMap,TSimilarityMap *ccMap,TClusters *clusters,
               TClusterToLetterMap *clMap)

{
  mapped_type mVar1;
  pointer piVar2;
  TClusters *txt;
  TClusterToLetterMap *this;
  uint uVar3;
  mapped_type_conflict *pmVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int i;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int i_1;
  int iVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  TProb TVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  int ii;
  float local_f4;
  float local_f0;
  int i2;
  TClusters *local_e8;
  float local_e0;
  int i3;
  float local_d8;
  float local_d4;
  uint local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  TClusterToLetterMap *local_c0;
  float local_b4;
  ulong local_b0;
  TFreqMap *local_a8;
  TSimilarityMap *local_a0;
  long local_98;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> fixed;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> used;
  
  uVar16 = (ulong)((long)(clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  uVar7 = 0;
  iVar15 = (int)uVar16;
  uVar8 = 0;
  if (0 < iVar15) {
    uVar8 = uVar16 & 0xffffffff;
  }
  fVar17 = 0.0;
  lVar10 = 0x10;
  iVar11 = 1;
  iVar12 = 0;
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    lVar14 = lVar10;
    for (iVar13 = iVar11; iVar13 < iVar15; iVar13 = iVar13 + 1) {
      fVar17 = (float)((double)fVar17 +
                      *(double *)
                       (*(long *)&(ccMap->
                                  super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar7].
                                  super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                                  super__Vector_impl_data + lVar14));
      iVar12 = iVar12 + 1;
      lVar14 = lVar14 + 0x10;
    }
    lVar10 = lVar10 + 0x10;
    iVar11 = iVar11 + 1;
  }
  local_e8 = clusters;
  local_a8 = freqMap;
  local_a0 = ccMap;
  printf("Average cc = %g\n",(double)(fVar17 / (float)iVar12));
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear(&clMap->_M_t);
  used._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &used._M_t._M_impl.super__Rb_tree_header._M_header;
  used._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  used._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fixed._M_t._M_impl.super__Rb_tree_header._M_header;
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fixed._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar14 = 0;
  local_c0 = clMap;
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  used._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       used._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar10 = 0;
      piVar2 = (params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar10 < (int)((ulong)((long)(params->hint).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
      lVar10 = lVar10 + 1) {
    if ((-1 < *(int *)((long)piVar2 + lVar14)) &&
       (pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[](&fixed,(key_type_conflict *)
                                   ((long)(local_e8->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start + lVar14)),
       clMap = local_c0, *pmVar4 == false)) {
      mVar1 = *(mapped_type *)
               ((long)(params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar14);
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](local_c0,(key_type_conflict *)
                                   ((long)(local_e8->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start + lVar14));
      *pmVar5 = mVar1;
      pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[](&used,(key_type_conflict *)
                                ((long)(params->hint).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar14));
      *pmVar4 = true;
      pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[](&fixed,(key_type_conflict *)
                                 ((long)(local_e8->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start + lVar14));
      *pmVar4 = true;
      printf("Fixed %d\n",
             (ulong)*(uint *)((long)(local_e8->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar14));
      clMap = local_c0;
    }
    lVar14 = lVar14 + 4;
  }
  ii = 0;
  for (i2 = 0; txt = local_e8, i2 < params->maxClusters; i2 = i2 + 1) {
    pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&fixed,&i2);
    if (*pmVar4 == false) {
      do {
        pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[](&used,&ii);
        iVar11 = ii;
        ii = ii + 1;
      } while (*pmVar4 != false);
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](local_c0,&i2);
      *pmVar5 = iVar11;
    }
    clMap = local_c0;
  }
  local_e0 = params->temp0;
  local_cc = params->wLanguageModel;
  local_f4 = costF(local_a0,local_e8);
  TVar19 = calcScore0(params,local_a8,txt,clMap);
  local_d8 = (float)TVar19;
  local_f0 = local_cc * local_d8 + local_f4;
  local_b0 = 0;
  local_98 = std::chrono::_V2::system_clock::now();
  local_b4 = local_f0;
  uVar9 = 0;
  fVar17 = local_f0;
  fVar18 = local_f4;
  while ((int)uVar9 < params->saMaxIterations) {
    local_f4 = fVar18;
    local_f0 = fVar17;
    if ((int)uVar9 % 10000 == 0) {
      lVar10 = std::chrono::_V2::system_clock::now();
      printf("Speed: %6.2f iter/ms, Iter %5d : temp = %16.4f, cost0 = %8.4f, costCL = %8.4f, costLM = %8.4f\n"
             ,(double)((float)(int)uVar9 / (float)((lVar10 - local_98) / 1000000)),(double)local_e0,
             (double)local_f0,(double)local_f4,(double)local_d8,(ulong)uVar9,
             (lVar10 - local_98) % 1000000);
      lVar10 = 0;
      for (lVar14 = 0;
          piVar2 = (local_e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start,
          lVar14 < (int)((ulong)((long)(local_e8->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >>
                        2); lVar14 = lVar14 + 1) {
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](local_c0,(key_type_conflict *)((long)piVar2 + lVar10));
        putchar(*pmVar5 + 0x60);
        lVar10 = lVar10 + 4;
      }
      putchar(10);
    }
    if ((local_b4 != local_f0) || (NAN(local_b4) || NAN(local_f0))) {
      local_b0 = 0;
      local_b4 = local_f0;
    }
    else {
      uVar3 = (int)local_b0 + 1;
      local_b0 = (ulong)uVar3;
      dVar20 = (double)(int)uVar3;
      dVar21 = (double)params->saMaxIterations * 0.01;
      if ((dVar21 == dVar20) && (!NAN(dVar21) && !NAN(dVar20))) {
        puts("No improvement for long time. Aborting");
        uVar9 = params->saMaxIterations + 1;
      }
    }
    local_d0 = uVar9;
    iVar11 = rand();
    iVar12 = rand();
    ii = iVar12 % params->maxClusters;
    iVar12 = rand();
    i2 = iVar12 % params->maxClusters;
    iVar12 = rand();
    i3 = iVar12 % params->maxClusters;
    while( true ) {
      iVar11 = iVar11 % iVar15;
      if ((params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar11] < 0) break;
      iVar11 = rand();
    }
    iVar12 = (local_e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[iVar11];
    iVar13 = iVar12;
    while (iVar12 == iVar13) {
      iVar13 = rand();
      iVar13 = iVar13 % params->maxClusters;
      (local_e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar11] = iVar13;
    }
    local_c4 = costFUpdate(local_a0,local_e8,iVar11,iVar12,local_f4);
    local_c8 = local_cc * local_d8 + local_c4;
    if (local_c8 - local_f0 <= 0.0) {
      local_d4 = expf(((local_c8 - local_f0) / local_e0) * 0.01);
      fVar17 = frand();
      if (local_d4 <= fVar17) {
        (local_e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[iVar11] = iVar12;
        local_c4 = local_f4;
        local_c8 = local_f0;
      }
    }
    this = local_c0;
    while (((i2 == i3 ||
            (pmVar4 = std::
                      map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                      operator[](&fixed,&i2), *pmVar4 != false)) ||
           (pmVar4 = std::
                     map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                     operator[](&fixed,&i3), *pmVar4 == true))) {
      iVar11 = rand();
      i2 = iVar11 % params->maxClusters;
      iVar11 = rand();
      i3 = iVar11 % params->maxClusters;
    }
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](this,&i2);
    pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](this,&i3);
    mVar1 = *pmVar5;
    *pmVar5 = *pmVar6;
    *pmVar6 = mVar1;
    while (pmVar4 = std::
                    map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                    operator[](&fixed,&ii), *pmVar4 == true) {
      iVar11 = rand();
      ii = iVar11 % params->maxClusters;
    }
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](this,&ii);
    mVar1 = *pmVar5;
    do {
      iVar11 = rand();
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](this,&ii);
    } while (*pmVar5 == iVar11 % 0x1b);
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](this,&ii);
    *pmVar5 = iVar11 % 0x1b;
    TVar19 = calcScore0(params,local_a8,local_e8,this);
    fVar22 = (float)TVar19;
    fVar17 = local_cc * fVar22 + local_c4;
    if (fVar17 - local_c8 <= 0.0) {
      local_f4 = fVar22;
      local_f0 = fVar17;
      local_d4 = expf(((fVar17 - local_c8) / local_e0) * 0.01);
      fVar18 = frand();
      fVar17 = local_f0;
      fVar22 = local_f4;
      if (local_d4 <= fVar18) {
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](this,&ii);
        *pmVar5 = mVar1;
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](this,&i2);
        pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](this,&i3);
        mVar1 = *pmVar5;
        *pmVar5 = *pmVar6;
        *pmVar6 = mVar1;
        fVar17 = local_c8;
        fVar22 = local_d8;
      }
    }
    local_e0 = local_e0 * params->coolingRate;
    fVar18 = local_c4;
    local_d8 = fVar22;
    uVar9 = local_d0 + 1;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&fixed._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&used._M_t);
  return true;
}

Assistant:

bool doSimulatedAnnealing5(
        const TParameters & params,
        const TFreqMap & freqMap,
        const TSimilarityMap & ccMap,
        TClusters & clusters,
        TClusterToLetterMap & clMap
        ) {

        int n = clusters.size();

        int ncc = 0;
        float ccavg = 0.0;
        for (int j = 0; j < n; ++j) {
            for (int i = j + 1; i < n; ++i) {
                ccavg += ccMap[j][i].cc;
                ++ncc;
            }
        }
        ccavg /= ncc;
        printf("Average cc = %g\n", ccavg);

        clMap.clear();
        std::map<TLetter, bool> used;
        std::map<TClusterId, bool> fixed;
        for (int i = 0; i < (int) params.hint.size(); ++i) {
            if (params.hint[i] < 0) continue;
            //if (used[params.hint[i]]) continue;
            if (fixed[clusters[i]]) continue;

            clMap[clusters[i]] = params.hint[i];
            used[params.hint[i]] = true;
            fixed[clusters[i]] = true;
            printf("Fixed %d\n", clusters[i]);
        }

        {
            int ii = 0;
            for (int i = 0; i < params.maxClusters; ++i) {
                if (fixed[i]) continue;
                while (used[ii]) ++ii;
                clMap[i] = ii++;
            }
        }

        float wlm = params.wLanguageModel;
        float temp = params.temp0;
        float cost0CL = costF(ccMap, clusters);
        float cost0LM = calcScore0(params, freqMap, clusters, clMap);
        float cost0 = cost0CL + wlm*cost0LM;

        int nRepeat = 0;
        float costOld = cost0;

        auto tStart = std::chrono::high_resolution_clock::now();

        for (int iter = 0; iter < params.saMaxIterations; ++iter) {
            if (iter%10000 == 0) {
                auto tEnd = std::chrono::high_resolution_clock::now();
                float iterPerT = (float)(iter)/((float)(std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count()));

                printf("Speed: %6.2f iter/ms, Iter %5d : temp = %16.4f, cost0 = %8.4f, costCL = %8.4f, costLM = %8.4f\n",
                       iterPerT, iter, temp, cost0, cost0CL, cost0LM);
                for (int i = 0; i < (int) clusters.size(); ++i) { printf("%c", 'a'+clMap[clusters[i]]-1); }
                printf("\n");
            }

            if (costOld == cost0) {
                //if (++nRepeat == 0.005*params.saMaxIterations) {
                //    printf("Heating\n");
                //    temp *= 100.1f;
                //}
                if (++nRepeat == 0.01*params.saMaxIterations) {
                    printf("No improvement for long time. Aborting\n");
                    iter = params.saMaxIterations + 1;
                }
            } else {
                nRepeat = 0;
                costOld = cost0;
            }

            int cid = -1;
            int i1l = -1;
            int i = rand()%n;
            int i1 = rand()%params.maxClusters;
            int i2 = rand()%params.maxClusters;
            int i3 = rand()%params.maxClusters;

            float costCurCL = cost0CL;
            float costCurLM = cost0LM;

            {
                while (params.hint[i] >= 0) {
                    i = rand()%n;
                }

                cid = clusters[i];
                while (cid == clusters[i]) {
                    clusters[i] = rand()%params.maxClusters;
                }

                costCurCL = costFUpdate(ccMap, clusters, i, cid, cost0CL);

                float cost1 = costCurCL + wlm*cost0LM;
                float delta = cost1 - cost0;
                if (delta > 0 || (std::exp(0.01f*(delta/temp)) > frand())) {
                    cost0CL = costCurCL;
                    cost0 = cost1;
                } else {
                    clusters[i] = cid;
                }
            }

            {
                while (i2 == i3 || fixed[i2] || fixed[i3]) {
                    i2 = rand()%params.maxClusters;
                    i3 = rand()%params.maxClusters;
                }
                std::swap(clMap[i2], clMap[i3]);

                while (fixed[i1]) {
                    i1 = rand()%params.maxClusters;
                }
                i1l = clMap[i1];
                int letterNew = rand()%27;
                while (clMap[i1] == letterNew) {
                    letterNew = rand()%27;
                }

                clMap[i1] = letterNew;

                costCurLM = calcScore0(params, freqMap, clusters, clMap);

                float cost1 = cost0CL + wlm*costCurLM;
                float delta = cost1 - cost0;
                if (delta > 0 || (std::exp(0.01f*(delta/temp)) > frand())) {
                    cost0LM = costCurLM;
                    cost0 = cost1;
                } else {
                    clMap[i1] = i1l;
                    std::swap(clMap[i2], clMap[i3]);
                }
            }

            temp *= params.coolingRate;
        }

        return true;
    }